

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

char * GetOpName(SynModifyAssignType type)

{
  if (type - SYN_MODIFY_ASSIGN_ADD < 0xb) {
    return &DAT_00358ec4 + *(int *)(&DAT_00358ec4 + (ulong)(type - SYN_MODIFY_ASSIGN_ADD) * 4);
  }
  __assert_fail("!\"unknown operation type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0xef0,"const char *GetOpName(SynModifyAssignType)");
}

Assistant:

const char* GetOpName(SynModifyAssignType type)
{
	switch(type)
	{
	case SYN_MODIFY_ASSIGN_ADD:
		return "+=";
	case SYN_MODIFY_ASSIGN_SUB:
		return "-=";
	case SYN_MODIFY_ASSIGN_MUL:
		return "*=";
	case SYN_MODIFY_ASSIGN_DIV:
		return "/=";
	case SYN_MODIFY_ASSIGN_POW:
		return "**=";
	case SYN_MODIFY_ASSIGN_MOD:
		return "%=";
	case SYN_MODIFY_ASSIGN_SHL:
		return "<<=";
	case SYN_MODIFY_ASSIGN_SHR:
		return ">>=";
	case SYN_MODIFY_ASSIGN_BIT_AND:
		return "&=";
	case SYN_MODIFY_ASSIGN_BIT_OR:
		return "|=";
	case SYN_MODIFY_ASSIGN_BIT_XOR:
		return "^=";
	default:
		break;
	}

	assert(!"unknown operation type");
	return "";
}